

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

WString * __thiscall
Jinx::Variant::GetWString_abi_cxx11_(WString *__return_storage_ptr__,Variant *this)

{
  int iVar1;
  WString *outString;
  _Alloc_hider utf8In;
  char32_t utf32CodePoint;
  size_t numOut;
  char32_t local_5c;
  size_t local_58;
  String local_50;
  
  GetString_abi_cxx11_(&local_50,this);
  utf8In._M_p = local_50._M_dataplus._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>::reserve
            (__return_storage_ptr__,local_50._M_string_length);
  iVar1 = (int)utf8In._M_p;
  local_5c = L'\0';
  local_58 = 0;
  while (*utf8In._M_p != '\0') {
    Impl::ConvertUtf8ToUtf32
              (utf8In._M_p,
               (ulong)(uint)(((int)local_50._M_string_length + iVar1) - (int)utf8In._M_p),&local_5c,
               &local_58);
    utf8In._M_p = utf8In._M_p + local_58;
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>::
    push_back(__return_storage_ptr__,local_5c);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
              (&local_50,local_50.field_2._M_allocated_capacity);
  }
  return __return_storage_ptr__;
}

Assistant:

inline WString Variant::GetWString() const
	{
		return Impl::ConvertUtf8ToWString(GetString());
	}